

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

bool math::wide_integer::
     miller_rabin<math::wide_integer::uniform_int_distribution<2048u,unsigned_int,std::allocator<unsigned_int>,false>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,2048u,unsigned_int,std::allocator<unsigned_int>,false>
               (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *n,
               unsigned_fast_type number_of_trials,
               uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
               *distribution,
               mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *generator)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  pointer pvVar4;
  bool bVar5;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> eVar6;
  bool bVar7;
  unsigned_long uVar8;
  unsigned_fast_type uVar9;
  ulong uVar10;
  ulong uVar11;
  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *in_R8;
  _Ct __m2;
  anon_class_1_0_00000001 local_1c1;
  local_wide_integer_type np;
  local_wide_integer_type nm1;
  local_wide_integer_type y;
  local_double_width_type np_dbl;
  local_wide_integer_type q;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_120;
  local_param_type params;
  local_double_width_type yd;
  
  detail::fixed_dynamic_array<unsigned_int,_64U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
            ((fixed_dynamic_array<unsigned_int,_64U,_std::allocator<unsigned_int>_> *)&np,&n->values
            );
  uVar1 = *np.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  nm1.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array =
       (_func_int **)
       CONCAT44(nm1.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                _vptr_dynamic_array._4_4_,uVar1);
  if ((uVar1 & 1) == 0) {
    if (uVar1 == 2) {
      params.param_a.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
      _vptr_dynamic_array._0_4_ = 2;
      bVar5 = operator==(&np,(uint *)&params);
      goto LAB_001a54a9;
    }
  }
  else {
    if (uVar1 < 0xe4) {
      params.param_a.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
      _vptr_dynamic_array._0_4_ = 0xe3;
      eVar6 = operator<=(&np,(uint *)&params);
      if (eVar6) {
        if (uVar1 == 1) {
          params.param_a.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          _vptr_dynamic_array._0_4_ = 1;
          eVar6 = operator==(&np,(uint *)&params);
          if (eVar6) goto LAB_001a54a7;
        }
        memcpy(&params,&DAT_001c7b6c,0xc0);
        bVar5 = detail::binary_search_unsafe<unsigned_int_const*,unsigned_int>
                          ((uint *)&params,(uint *)&yd,(uint *)&nm1);
        goto LAB_001a54a9;
      }
    }
    nm1.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
    _vptr_dynamic_array = (_func_int **)0xe221f97c30e94e1d;
    operator%(&params.param_a,&np,(unsigned_long *)&nm1);
    uVar8 = uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
            extract_builtin_integral_type<unsigned_long,void>
                      ((uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false> *)&params)
    ;
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   &params);
    if ((uVar8 != 0) &&
       (uVar8 = std::__detail::__gcd<unsigned_long>(uVar8,0xe221f97c30e94e1d), uVar8 == 1)) {
      nm1.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
      _vptr_dynamic_array = (_func_int **)0x6329899ea9f2714b;
      operator%(&params.param_a,&np,(unsigned_long *)&nm1);
      uVar8 = uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
              extract_builtin_integral_type<unsigned_long,void>
                        ((uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false> *)
                         &params);
      util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
      ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *
                     )&params);
      if ((uVar8 != 0) &&
         (uVar8 = std::__detail::__gcd<unsigned_long>(uVar8,0x6329899ea9f2714b), uVar8 == 1)) {
        nm1.values.
        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
        _vptr_dynamic_array = (_func_int **)0x58edcb4c9ed39c8b;
        operator%(&params.param_a,&np,(unsigned_long *)&nm1);
        uVar8 = uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
                extract_builtin_integral_type<unsigned_long,void>
                          ((uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false> *)
                           &params);
        util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
        ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                        *)&params);
        if ((uVar8 != 0) &&
           (uVar8 = std::__detail::__gcd<unsigned_long>(uVar8,0x58edcb4c9ed39c8b), uVar8 == 1)) {
          nm1.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          _vptr_dynamic_array = (_func_int **)0x9966ff94fd516fb;
          operator%(&params.param_a,&np,(unsigned_long *)&nm1);
          uVar8 = uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
                  extract_builtin_integral_type<unsigned_long,void>
                            ((uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false> *)
                             &params);
          util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
          ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                          *)&params);
          if ((uVar8 != 0) &&
             (uVar8 = std::__detail::__gcd<unsigned_long>(uVar8,0x9966ff94fd516fb), uVar8 == 1)) {
            nm1.values.
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
            _vptr_dynamic_array = (_func_int **)0x49801d135ff5;
            operator%(&params.param_a,&np,(unsigned_long *)&nm1);
            uVar8 = uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
                    extract_builtin_integral_type<unsigned_long,void>
                              ((uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false> *)
                               &params);
            util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
            ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                            *)&params);
            if ((uVar8 != 0) &&
               (uVar8 = std::__detail::__gcd<unsigned_long>(uVar8,0x49801d135ff5), uVar8 == 1)) {
              params.param_a.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              _vptr_dynamic_array._0_4_ = 1;
              operator-(&nm1,&np,(uint *)&params);
              uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
              uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::
              value&&std::is_unsigned<unsigned_int>::value)&&(std::numeric_limits<unsigned_int>::
              digits<=std::numeric_limits<unsigned_int>::digits),void>::type__
                        (&q,0xe4,(enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_<__std::numeric_limits<limb_type>::digits))>
                                  *)0x0);
              powm<math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,2048u,unsigned_int,std::allocator<unsigned_int>,false>
                        (&params.param_a,(wide_integer *)&q,&nm1,&np,in_R8);
              util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
              ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                              *)&q);
              bVar5 = miller_rabin<math::wide_integer::uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                      ::anon_class_1_0_00000001::operator()(&local_1c1,&params.param_a);
              util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
              ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                              *)&params);
              if (bVar5) {
                uVar9 = lsb<2048u,unsigned_int,std::allocator<unsigned_int>,false>(&nm1);
                operator>>(&q,&nm1,(uint)uVar9);
                uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
                uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>
                ::value&&std::is_unsigned<unsigned_int>::value)&&(std::numeric_limits<unsigned_int>
                ::digits<=std::numeric_limits<unsigned_int>::digits),void>::type__
                          (&np_dbl,2,
                           (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_<__std::numeric_limits<limb_type>::digits))>
                            *)0x0);
                yd.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                _vptr_dynamic_array._0_4_ = 2;
                operator-(&y,&np,(uint *)&yd);
                uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                param_type::param_type(&params,(result_type *)&np_dbl,&y);
                util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                *)&y);
                util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                *)&np_dbl);
                uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                uintwide_t<2048U,_false,_nullptr>(&np_dbl,&np);
                bVar5 = true;
                uVar11 = 0;
LAB_001a532d:
                uniform_int_distribution<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
                generate<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,64>
                          ((result_type *)&yd,distribution,generator,&params);
                powm<math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,2048u,unsigned_int,std::allocator<unsigned_int>,false>
                          ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                           &y,(wide_integer *)&yd,&q,&np,in_R8);
                util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                *)&yd);
                uVar10 = 0;
                bVar2 = bVar5;
                do {
                  while( true ) {
                    uVar10 = uVar10 + 1;
                    bVar5 = uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                            operator!=((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                        *)&y,&nm1);
                    if ((!bVar5) ||
                       (bVar5 = miller_rabin<math::wide_integer::uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                ::anon_class_1_0_00000001::operator()(&local_1c1,&y),
                       bVar5 || (~bVar2 & 1U) != 0)) {
                      bVar7 = miller_rabin<math::wide_integer::uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                              ::anon_class_1_0_00000001::operator()(&local_1c1,&y);
                      bVar5 = bVar2;
                      if (bVar7) {
                        bVar5 = false;
                      }
                      if (uVar10 == 1) {
                        bVar5 = bVar2;
                      }
                      uVar11 = uVar11 + 1;
                      util::
                      dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                      ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                      *)&y);
                      if ((uVar11 < number_of_trials) && (bVar5)) goto LAB_001a532d;
                      util::
                      dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                      ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                      *)&np_dbl);
                      uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                      ::param_type::~param_type(&params);
                      util::
                      dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                      ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                      *)&q);
                      goto LAB_001a54cd;
                    }
                    if ((uVar9 & 0xffffffff) == uVar10) break;
                    uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                    uintwide_t<2048U,_false,_nullptr>
                              ((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)&yd,(uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                       *)&y);
                    uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::operator*=
                              ((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)&yd,(uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                       *)&yd);
                    uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::operator%=
                              ((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)&yd,&np_dbl);
                    uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                    uintwide_t<4096U,_false,_nullptr>
                              ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)&local_120,
                               (uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)&yd);
                    pvVar4 = y.values.
                             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                             .elems;
                    sVar3 = y.values.
                            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                            .elem_count;
                    y.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elem_count = local_120.elem_count;
                    local_120.elem_count = sVar3;
                    y.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems = local_120.elems;
                    local_120.elems = pvVar4;
                    util::
                    dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                    ~dynamic_array(&local_120);
                    util::
                    dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                    ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                    *)&yd);
                  }
                  bVar2 = false;
                } while( true );
              }
              bVar5 = false;
LAB_001a54cd:
              util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
              ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                              *)&nm1);
              goto LAB_001a54a9;
            }
          }
        }
      }
    }
  }
LAB_001a54a7:
  bVar5 = false;
LAB_001a54a9:
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)&np);
  return bVar5;
}

Assistant:

auto miller_rabin(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& n, // NOLINT(readability-function-cognitive-complexity)
                    const unsigned_fast_type                                     number_of_trials,
                          DistributionType&                                      distribution,
                          GeneratorType&                                         generator) -> bool
  {
    // This Miller-Rabin primality test is loosely based on
    // an adaptation of some code from Boost.Multiprecision.
    // The Boost.Multiprecision code can be found here:
    // https://www.boost.org/doc/libs/1_87_0/libs/multiprecision/doc/html/boost_multiprecision/tut/primetest.html

    // Note: Some comments in this subroutine use the Wolfram Language(TM).
    // These can be exercised at the web links to WolframAlpha(R) provided

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_limb_type         = typename local_wide_integer_type::limb_type;

    const local_wide_integer_type np((!local_wide_integer_type::is_neg(n)) ? n : -n);

    {
      const auto n0 = static_cast<local_limb_type>(np);

      const auto n_is_even =
        (static_cast<local_limb_type>(n0 & static_cast<local_limb_type>(UINT8_C(1))) == static_cast<local_limb_type>(UINT8_C(0)));

      if(n_is_even)
      {
        // The prime candidate is not prime because n is even.
        // Also handle the trivial special case of (n = 2).

        const auto n_is_two =
          ((n0 == static_cast<local_limb_type>(UINT8_C(2))) && (np == static_cast<local_limb_type>(UINT8_C(2))));

        return n_is_two;
      }

      if((n0 <= static_cast<local_limb_type>(UINT8_C(227))) && (np <= static_cast<local_limb_type>(UINT8_C(227))))
      {
        // This handles the trivial special case of the (non-primality) of 1.
        const auto n_is_one =
          ((n0 == static_cast<local_limb_type>(UINT8_C(1))) && (np == static_cast<local_limb_type>(UINT8_C(1))));

        if(n_is_one)
        {
          return false;
        }

        // Exclude pure small primes from 3...227.
        // Table[Prime[i], {i, 2, 49}] =
        // {
        //     3,   5,   7,  11,  13,  17,  19,  23,
        //    29,  31,  37,  41,  43,  47,  53,  59,
        //    61,  67,  71,  73,  79,  83,  89,  97,
        //   101, 103, 107, 109, 113, 127, 131, 137,
        //   139, 149, 151, 157, 163, 167, 173, 179,
        //   181, 191, 193, 197, 199, 211, 223, 227
        // }
        // See also:
        // https://www.wolframalpha.com/input/?i=Table%5BPrime%5Bi%5D%2C+%7Bi%2C+2%2C+49%7D%5D

        constexpr detail::array_detail::array<local_limb_type, static_cast<std::size_t>(UINT8_C(48))> small_primes =
        {
          static_cast<local_limb_type>(UINT8_C(  3)), static_cast<local_limb_type>(UINT8_C(  5)), static_cast<local_limb_type>(UINT8_C(  7)), static_cast<local_limb_type>(UINT8_C( 11)), static_cast<local_limb_type>(UINT8_C( 13)), static_cast<local_limb_type>(UINT8_C( 17)), static_cast<local_limb_type>(UINT8_C( 19)), static_cast<local_limb_type>(UINT8_C( 23)),
          static_cast<local_limb_type>(UINT8_C( 29)), static_cast<local_limb_type>(UINT8_C( 31)), static_cast<local_limb_type>(UINT8_C( 37)), static_cast<local_limb_type>(UINT8_C( 41)), static_cast<local_limb_type>(UINT8_C( 43)), static_cast<local_limb_type>(UINT8_C( 47)), static_cast<local_limb_type>(UINT8_C( 53)), static_cast<local_limb_type>(UINT8_C( 59)),
          static_cast<local_limb_type>(UINT8_C( 61)), static_cast<local_limb_type>(UINT8_C( 67)), static_cast<local_limb_type>(UINT8_C( 71)), static_cast<local_limb_type>(UINT8_C( 73)), static_cast<local_limb_type>(UINT8_C( 79)), static_cast<local_limb_type>(UINT8_C( 83)), static_cast<local_limb_type>(UINT8_C( 89)), static_cast<local_limb_type>(UINT8_C( 97)),
          static_cast<local_limb_type>(UINT8_C(101)), static_cast<local_limb_type>(UINT8_C(103)), static_cast<local_limb_type>(UINT8_C(107)), static_cast<local_limb_type>(UINT8_C(109)), static_cast<local_limb_type>(UINT8_C(113)), static_cast<local_limb_type>(UINT8_C(127)), static_cast<local_limb_type>(UINT8_C(131)), static_cast<local_limb_type>(UINT8_C(137)),
          static_cast<local_limb_type>(UINT8_C(139)), static_cast<local_limb_type>(UINT8_C(149)), static_cast<local_limb_type>(UINT8_C(151)), static_cast<local_limb_type>(UINT8_C(157)), static_cast<local_limb_type>(UINT8_C(163)), static_cast<local_limb_type>(UINT8_C(167)), static_cast<local_limb_type>(UINT8_C(173)), static_cast<local_limb_type>(UINT8_C(179)),
          static_cast<local_limb_type>(UINT8_C(181)), static_cast<local_limb_type>(UINT8_C(191)), static_cast<local_limb_type>(UINT8_C(193)), static_cast<local_limb_type>(UINT8_C(197)), static_cast<local_limb_type>(UINT8_C(199)), static_cast<local_limb_type>(UINT8_C(211)), static_cast<local_limb_type>(UINT8_C(223)), static_cast<local_limb_type>(UINT8_C(227))
        };

        return detail::binary_search_unsafe(small_primes.cbegin(), small_primes.cend(), n0);
      }
    }

    // Check small factors.

    // Exclude small prime factors from { 3 ...  53 }.
    // Product[Prime[i], {i, 2, 16}] = 16294579238595022365
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+2%2C+16%7D%5D
    {
      constexpr std::uint64_t pp0 = UINT64_C(16294579238595022365);

      const auto m0 = static_cast<std::uint64_t>(np % pp0);

      if((m0 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m0, pp0) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    // Exclude small prime factors from { 59 ... 101 }.
    // Product[Prime[i], {i, 17, 26}] = 7145393598349078859
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+17%2C+26%7D%5D
    {
      constexpr std::uint64_t pp1 = UINT64_C(7145393598349078859);

      const auto m1 = static_cast<std::uint64_t>(np % pp1);

      if((m1 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m1, pp1) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    // Exclude small prime factors from { 103 ... 149 }.
    // Product[Prime[i], {i, 27, 35}] = 6408001374760705163
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+27%2C+35%7D%5D
    {
      constexpr std::uint64_t pp2 = UINT64_C(6408001374760705163);

      const auto m2 = static_cast<std::uint64_t>(np % pp2);

      if((m2 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m2, pp2) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    // Exclude small prime factors from { 151 ... 191 }.
    // Product[Prime[i], {i, 36, 43}] = 690862709424854779
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+36%2C+43%7D%5D
    {
      constexpr std::uint64_t pp3 = UINT64_C(690862709424854779);

      const auto m3 = static_cast<std::uint64_t>(np % pp3);

      if((m3 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m3, pp3) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    // Exclude small prime factors from { 193 ... 227 }.
    // Product[Prime[i], {i, 44, 49}] = 80814592450549
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+44%2C+49%7D%5D
    {
      constexpr std::uint64_t pp4 = UINT64_C(80814592450549);

      const auto m4 = static_cast<std::uint64_t>(np % pp4);

      if((m4 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m4, pp4) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    const local_wide_integer_type nm1 { np - static_cast<unsigned>(UINT8_C(1)) };

    auto
      local_functor_isone
      {
        [](const local_wide_integer_type& t1)
        {
          return
          (
               (static_cast<local_limb_type>(t1) == local_limb_type { UINT8_C(1) })
            && (t1 == unsigned { UINT8_C(1) })
          );
        }
      };

    // Since we have already excluded all small factors
    // up to and including 227, n is greater than 227.

    {
      // Perform a single Fermat test which will
      // exclude many non-prime candidates.

      const local_wide_integer_type fn { powm(local_wide_integer_type(static_cast<local_limb_type>(228U)), nm1, np) };

      if(!local_functor_isone(fn))
      {
        return false;
      }
    }

    const unsigned k { static_cast<unsigned>(lsb(nm1)) };

    const local_wide_integer_type q { nm1 >> k };

    using local_param_type = typename DistributionType::param_type;

    const local_param_type
      params
      {
        local_wide_integer_type { unsigned { UINT8_C(2) } },
        np - unsigned { UINT8_C(2) }
      };

    // Assume the test will pass, even though it usually does not pass.
    bool result_candidate_is_prime { true };

    ::std::size_t idx { UINT8_C(0) };

    using local_double_width_type = typename local_wide_integer_type::double_width_type;

    const local_double_width_type np_dbl { np };

    // Loop over the trials to perform the primality testing.
    do
    {
      local_wide_integer_type y { powm(distribution(generator, params), q, np) };

      ::std::size_t jdx { UINT8_C(0) };

      // Continue while y is not nm1, and while y is not 1,
      // and while the result is true.

      while((y != nm1) && (!local_functor_isone(y)) && result_candidate_is_prime) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++jdx;

        if(jdx == static_cast<std::size_t>(k))
        {
          // Mark failure if max iterations reached.
          result_candidate_is_prime = false;
        }
        else
        {
          // Continue with the next value of y.

          // Manually calculate: y = powm(y, 2, np);

          local_double_width_type yd { y };

          yd *= yd;
          yd %= np_dbl;

          y = local_wide_integer_type { yd };
        }
      }

      // Check for (y == 1) after the loop.
      if(local_functor_isone(y) && (jdx != ::std::size_t { UINT8_C(0) }))
      {
        // Mark failure if (y == 1) and (jdx != 0).
        result_candidate_is_prime = false;
      }

      ++idx;
    }
    while((idx < number_of_trials) && result_candidate_is_prime);

    return result_candidate_is_prime;
  }